

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O1

void load_qtlist(void)

{
  int iVar1;
  qtmsg *pqVar2;
  char *__s2;
  undefined8 *puVar3;
  long lVar4;
  int n_classes;
  char qt_classes [16] [3];
  long qt_offsets [16];
  int local_ec;
  char local_e8 [48];
  long local_b8 [17];
  
  msg_file = dlb_fopen("quest.dat","r");
  if (msg_file == (dlb *)0x0) {
    panic("CANNOT OPEN QUEST TEXT FILE %s.","quest.dat");
  }
  Fread(&local_ec,4,1,msg_file);
  __s2 = local_e8;
  Fread(__s2,3,local_ec,msg_file);
  Fread(local_b8,8,local_ec,msg_file);
  qt_list_1 = 0;
  qt_list_0 = 0;
  if (0 < local_ec) {
    lVar4 = 0;
    do {
      iVar1 = strncmp("-",__s2,3);
      puVar3 = &qt_list_0;
      if (iVar1 == 0) {
LAB_00229f37:
        pqVar2 = construct_qtlist(local_b8[lVar4]);
        *puVar3 = pqVar2;
      }
      else {
        iVar1 = strncmp(urole.filecode,__s2,3);
        puVar3 = &qt_list_1;
        if (iVar1 == 0) goto LAB_00229f37;
      }
      lVar4 = lVar4 + 1;
      __s2 = __s2 + 3;
    } while (lVar4 < local_ec);
  }
  if ((qt_list_0 == 0) || (qt_list_1 == 0)) {
    impossible("load_qtlist: cannot load quest text.");
  }
  return;
}

Assistant:

void load_qtlist(void)
{
	int	n_classes, i;
	char	qt_classes[N_HDR][LEN_HDR];
	long	qt_offsets[N_HDR];

	msg_file = dlb_fopen(QTEXT_FILE, RDBMODE);
	if (!msg_file)
	    panic("CANNOT OPEN QUEST TEXT FILE %s.", QTEXT_FILE);

	/*
	 * Read in the number of classes, then the ID's & offsets for
	 * each header.
	 */
	Fread(&n_classes, sizeof(int), 1, msg_file);
	Fread(&qt_classes[0][0], sizeof(char)*LEN_HDR, n_classes, msg_file);
	Fread(qt_offsets, sizeof(long), n_classes, msg_file);

	/*
	 * Now construct the message lists for quick reference later
	 * on when we are actually paging the messages out.
	 */

	qt_list.common = qt_list.chrole = NULL;

	for (i = 0; i < n_classes; i++) {
	    if (!strncmp(COMMON_ID, qt_classes[i], LEN_HDR))
	    	qt_list.common = construct_qtlist(qt_offsets[i]);
	    else if (!strncmp(urole.filecode, qt_classes[i], LEN_HDR))
	    	qt_list.chrole = construct_qtlist(qt_offsets[i]);
	}

	if (!qt_list.common || !qt_list.chrole)
	    impossible("load_qtlist: cannot load quest text.");
	return;	/* no ***DON'T*** close the msg_file */
}